

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O3

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDeclsCtx::addImplicitData
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *this,DataStringT *data)

{
  Module *pMVar1;
  Memory *pMVar2;
  char *pcVar3;
  Result<wasm::Ok> *pRVar4;
  DataSegment *pDVar5;
  Const *pCVar6;
  undefined1 in_CL;
  string_view sVar7;
  Builder local_48;
  Result<wasm::Ok> *local_40;
  _Head_base<0UL,_wasm::DataSegment_*,_false> local_38;
  
  pMVar1 = this->wasm;
  pMVar2 = (pMVar1->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
           super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  local_40 = __return_storage_ptr__;
  pDVar5 = (DataSegment *)operator_new(0x50);
  (pDVar5->super_Named).name.super_IString.str._M_len = 0;
  (pDVar5->super_Named).name.super_IString.str._M_str = (char *)0x0;
  *(undefined8 *)&(pDVar5->super_Named).hasExplicitName = 0;
  (pDVar5->memory).super_IString.str._M_len = 0;
  (pDVar5->memory).super_IString.str._M_str = (char *)0x0;
  *(undefined8 *)&pDVar5->isPassive = 0;
  pDVar5->offset = (Expression *)0x0;
  (pDVar5->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pDVar5->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pDVar5->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pcVar3 = *(char **)((long)&(pMVar2->super_Importable).super_Named + 8);
  (pDVar5->memory).super_IString.str._M_len = *(size_t *)&(pMVar2->super_Importable).super_Named;
  (pDVar5->memory).super_IString.str._M_str = pcVar3;
  local_48.wasm = pMVar1;
  local_38._M_head_impl = pDVar5;
  pCVar6 = Builder::makeConstPtr(&local_48,0,(Type)(pMVar2->addressType).id);
  pDVar5->offset = (Expression *)pCVar6;
  std::vector<char,_std::allocator<char>_>::_M_move_assign(&pDVar5->data,data);
  pMVar1 = this->wasm;
  sVar7 = IString::interned((IString *)0xd,(string_view)ZEXT816(0xe2544b),(bool)in_CL);
  sVar7 = (string_view)Names::getValidDataSegmentName(pMVar1,(Name)sVar7);
  ((local_38._M_head_impl)->super_Named).name.super_IString.str = sVar7;
  Module::addDataSegment
            (this->wasm,
             (unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)&local_38);
  pRVar4 = local_40;
  *(__index_type *)
   ((long)&(local_40->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  if (local_38._M_head_impl != (DataSegment *)0x0) {
    std::default_delete<wasm::DataSegment>::operator()
              ((default_delete<wasm::DataSegment> *)&local_38,local_38._M_head_impl);
  }
  return pRVar4;
}

Assistant:

Result<> ParseDeclsCtx::addImplicitData(DataStringT&& data) {
  auto& mem = *wasm.memories.back();
  auto d = std::make_unique<DataSegment>();
  d->memory = mem.name;
  d->isPassive = false;
  d->offset = Builder(wasm).makeConstPtr(0, mem.addressType);
  d->data = std::move(data);
  d->name = Names::getValidDataSegmentName(wasm, "implicit-data");
  wasm.addDataSegment(std::move(d));
  return Ok{};
}